

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,true,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  
  if (count == 0) {
    lVar10 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = false_sel->sel_vector;
    lVar10 = 0;
    uVar11 = 0;
    do {
      uVar6 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar1[uVar11];
      }
      uVar9 = uVar11;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar11];
      }
      uVar14 = uVar11;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar11];
      }
      uVar16 = uVar11;
      if (psVar4 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar4[uVar11];
      }
      lVar8._0_4_ = adata[uVar9].months;
      lVar8._4_4_ = adata[uVar9].days;
      lVar13._0_4_ = bdata[uVar14].months;
      lVar13._4_4_ = bdata[uVar14].days;
      lVar7 = (lVar8 >> 0x20) + adata[uVar9].micros / 86400000000;
      lVar17 = adata[uVar9].micros % 86400000000;
      lVar15 = lVar7 % 0x1e;
      lVar18 = (long)(int)(undefined4)lVar8 + lVar7 / 0x1e;
      lVar8 = (lVar13 >> 0x20) + bdata[uVar14].micros / 86400000000;
      lVar12 = lVar8 % 0x1e;
      lVar8 = (long)(int)(undefined4)lVar13 + lVar8 / 0x1e;
      lVar7._0_4_ = cdata[uVar16].months;
      lVar7._4_4_ = cdata[uVar16].days;
      if ((lVar8 < lVar18) ||
         ((uVar9 = 1, lVar8 <= lVar18 &&
          ((lVar12 < lVar15 || ((lVar12 <= lVar15 && (bdata[uVar14].micros % 86400000000 < lVar17)))
           ))))) {
        lVar8 = (lVar7 >> 0x20) + cdata[uVar16].micros / 86400000000;
        lVar13 = lVar8 % 0x1e;
        lVar8 = (long)(int)(undefined4)lVar7 + lVar8 / 0x1e;
        uVar9 = 1;
        if (lVar18 <= lVar8) {
          if (lVar18 < lVar8) {
            uVar9 = 0;
          }
          else if (lVar15 <= lVar13) {
            uVar9 = (ulong)(cdata[uVar16].micros % 86400000000 < lVar17 && lVar13 <= lVar15);
          }
        }
      }
      psVar5[lVar10] = (sel_t)uVar6;
      lVar10 = uVar9 + lVar10;
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  return count - lVar10;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}